

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RuntimeCharTrie::Match
          (RuntimeCharTrie *this,Char *input,CharCount inputLength,CharCount *inputOffset,
          RegexStats *stats)

{
  RuntimeCharTrieEntry *pRVar1;
  bool bVar2;
  CharCount CVar3;
  long lVar4;
  long lVar5;
  
  CVar3 = *inputOffset;
  do {
    lVar4 = (long)this->count;
    if ((lVar4 == 0) || (inputLength <= CVar3)) {
      return lVar4 == 0;
    }
    if (stats != (RegexStats *)0x0) {
      stats->numCompares = stats->numCompares + 1;
    }
    pRVar1 = this->children;
    lVar5 = 1;
    while( true ) {
      this = &pRVar1->node;
      if (*(Char *)((long)(this + -1) + 8) == input[CVar3]) break;
      if ((ushort)input[CVar3] < (ushort)*(Char *)((long)(this + -1) + 8)) {
        return false;
      }
      pRVar1 = (RuntimeCharTrieEntry *)(this + 1);
      bVar2 = lVar4 <= lVar5;
      lVar5 = lVar5 + 1;
      if (bVar2) {
        return false;
      }
    }
    CVar3 = CVar3 + 1;
    *inputOffset = CVar3;
  } while( true );
}

Assistant:

bool RuntimeCharTrie::Match
        (const Char* const input
            , const CharCount inputLength
            , CharCount& inputOffset
#if ENABLE_REGEX_CONFIG_OPTIONS
            , RegexStats* stats
#endif
            ) const
    {
        const RuntimeCharTrie* curr = this;
        while (true)
        {
            if (curr->count == 0)
                return true;
            if (inputOffset >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif

#if 0
            int l = 0;
            int h = curr->count - 1;
            while (true)
            {
                if (l > h)
                    return false;
                int m = (l + h) / 2;
                if (curr->children[m].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[m].node;
                    break;
                }
                else if (CTU(curr->children[m].c) < CTU(input[inputOffset]))
                    l = m + 1;
                else
                    h = m - 1;
            }
#else
            int i = 0;
            while (true)
            {
                if (curr->children[i].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[i].node;
                    break;
                }
                else if (curr->children[i].c > input[inputOffset])
                    return false;
                else if (++i >= curr->count)
                    return false;
            }
#endif
        }
    }